

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selu_x86.cpp
# Opt level: O2

int __thiscall ncnn::SELU_x86::forward_inplace(SELU_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  undefined1 (*pauVar8) [16];
  int iVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar11 = 0;
  uVar6 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar6 = uVar11;
  }
  for (; uVar11 != uVar6; uVar11 = uVar11 + 1) {
    pvVar3 = bottom_top_blob->data;
    sVar4 = bottom_top_blob->elemsize;
    sVar5 = bottom_top_blob->cstep;
    pauVar8 = (undefined1 (*) [16])(sVar5 * uVar11 * sVar4 + (long)pvVar3);
    fVar1 = (this->super_SELU).alpha;
    fVar2 = (this->super_SELU).lambda;
    lVar12 = 0;
    for (iVar10 = 0; iVar10 + 3 < iVar9; iVar10 = iVar10 + 4) {
      auVar21 = minps(*pauVar8,ZEXT816(0));
      auVar22._8_4_ = 0x42b0c0a5;
      auVar22._0_8_ = 0x42b0c0a542b0c0a5;
      auVar22._12_4_ = 0x42b0c0a5;
      auVar22 = minps(auVar21,auVar22);
      auVar21._8_4_ = 0xc2b0c0a5;
      auVar21._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar21._12_4_ = 0xc2b0c0a5;
      auVar22 = maxps(auVar22,auVar21);
      fVar17 = auVar22._0_4_ * 1.442695 + 0.5;
      fVar18 = auVar22._4_4_ * 1.442695 + 0.5;
      fVar19 = auVar22._8_4_ * 1.442695 + 0.5;
      fVar20 = auVar22._12_4_ * 1.442695 + 0.5;
      fVar13 = (float)(int)fVar17;
      fVar14 = (float)(int)fVar18;
      fVar15 = (float)(int)fVar19;
      fVar16 = (float)(int)fVar20;
      fVar13 = fVar13 - (float)(-(uint)(fVar17 < fVar13) & 0x3f800000);
      fVar14 = fVar14 - (float)(-(uint)(fVar18 < fVar14) & 0x3f800000);
      fVar15 = fVar15 - (float)(-(uint)(fVar19 < fVar15) & 0x3f800000);
      fVar16 = fVar16 - (float)(-(uint)(fVar20 < fVar16) & 0x3f800000);
      fVar17 = fVar13 * -0.6931472 + auVar22._0_4_;
      fVar18 = fVar14 * -0.6931472 + auVar22._4_4_;
      fVar19 = fVar15 * -0.6931472 + auVar22._8_4_;
      fVar20 = fVar16 * -0.6931472 + auVar22._12_4_;
      auVar22 = maxps(*pauVar8,ZEXT816(0));
      *(float *)*pauVar8 =
           (((float)((int)fVar13 * 0x800000 + 0x3f800000) *
             (fVar17 + 1.0 +
             (((((fVar17 * 0.00019875691 + 0.0013981999) * fVar17 + 0.008333452) * fVar17 +
               0.041665796) * fVar17 + 0.16666666) * fVar17 + 0.5) * fVar17 * fVar17) + -1.0) *
            fVar1 + auVar22._0_4_) * fVar2;
      *(float *)(*pauVar8 + 4) =
           (((float)((int)fVar14 * 0x800000 + 0x3f800000) *
             (fVar18 + 1.0 +
             (((((fVar18 * 0.00019875691 + 0.0013981999) * fVar18 + 0.008333452) * fVar18 +
               0.041665796) * fVar18 + 0.16666666) * fVar18 + 0.5) * fVar18 * fVar18) + -1.0) *
            fVar1 + auVar22._4_4_) * fVar2;
      *(float *)(*pauVar8 + 8) =
           (((float)((int)fVar15 * 0x800000 + 0x3f800000) *
             (fVar19 + 1.0 +
             (((((fVar19 * 0.00019875691 + 0.0013981999) * fVar19 + 0.008333452) * fVar19 +
               0.041665796) * fVar19 + 0.16666666) * fVar19 + 0.5) * fVar19 * fVar19) + -1.0) *
            fVar1 + auVar22._8_4_) * fVar2;
      *(float *)(*pauVar8 + 0xc) =
           (((float)((int)fVar16 * 0x800000 + 0x3f800000) *
             (fVar20 + 1.0 +
             (((((fVar20 * 0.00019875691 + 0.0013981999) * fVar20 + 0.008333452) * fVar20 +
               0.041665796) * fVar20 + 0.16666666) * fVar20 + 0.5) * fVar20 * fVar20) + -1.0) *
            fVar1 + auVar22._12_4_) * fVar2;
      pauVar8 = pauVar8 + 1;
      lVar12 = lVar12 + 4;
    }
    fVar1 = (this->super_SELU).lambda;
    fVar2 = (this->super_SELU).alpha;
    lVar7 = sVar5 * sVar4 * uVar11;
    for (; (int)lVar12 < iVar9; lVar12 = lVar12 + 1) {
      fVar13 = *(float *)((long)pvVar3 + lVar12 * 4 + lVar7);
      if (0.0 <= fVar13) {
        fVar13 = fVar13 * (this->super_SELU).lambda;
      }
      else {
        fVar13 = expf(fVar13);
        fVar13 = (fVar13 + -1.0) * fVar1 * fVar2;
      }
      *(float *)((long)pvVar3 + lVar12 * 4 + lVar7) = fVar13;
    }
  }
  return 0;
}

Assistant:

int SELU_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int elempack = bottom_top_blob.elempack;
    int channels = bottom_top_blob.c;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero512 = _mm512_setzero_ps();
        __m512 _one512 = _mm512_set1_ps(1.f);
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        __m512 _lambda512 = _mm512_set1_ps(lambda);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);

            __m512 _pos = _mm512_max_ps(_zero512, _p);
            __m512 _neg = _mm512_min_ps(_zero512, _p);

            __m512 _blob = exp512_ps(_neg);
            _blob = _mm512_sub_ps(_blob, _one512);
            _blob = _mm512_mul_ps(_alpha512, _blob);
            _blob = _mm512_mul_ps(_lambda512, _mm512_add_ps(_pos, _blob));

            _mm512_storeu_ps(ptr, _blob);

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero256 = _mm256_setzero_ps();
        __m256 _one256 = _mm256_set1_ps(1.f);
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        __m256 _lambda256 = _mm256_set1_ps(lambda);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);

            __m256 _pos = _mm256_max_ps(_zero256, _p);
            __m256 _neg = _mm256_min_ps(_zero256, _p);

            __m256 _blob = exp256_ps(_neg);
            _blob = _mm256_sub_ps(_blob, _one256);
            _blob = _mm256_mul_ps(_alpha256, _blob);
            _blob = _mm256_mul_ps(_lambda256, _mm256_add_ps(_pos, _blob));

            _mm256_storeu_ps(ptr, _blob);

            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero128 = _mm_setzero_ps();
        __m128 _one128 = _mm_set1_ps(1.f);
        __m128 _alpha128 = _mm_set1_ps(alpha);
        __m128 _lambda128 = _mm_set1_ps(lambda);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);

            __m128 _pos = _mm_max_ps(_zero128, _p);
            __m128 _neg = _mm_min_ps(_zero128, _p);

            __m128 _blob = exp_ps(_neg);
            _blob = _mm_sub_ps(_blob, _one128);
            _blob = _mm_mul_ps(_alpha128, _blob);
            _blob = _mm_mul_ps(_lambda128, _mm_add_ps(_pos, _blob));

            _mm_storeu_ps(ptr, _blob);

            ptr += 4;
        }
#endif // __SSE2__
        float alphaxlambda = alpha * lambda;
        for (; i < size; i++)
        {
            // y = lambda * ( max(0, x) + min(0, alpha * (exp(x) - 1)) )
            if (*ptr < 0)
                *ptr = (expf(*ptr) - 1.f) * alphaxlambda;
            else
                *ptr = *ptr * lambda;
            ptr++;
        }
    }

    return 0;
}